

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frequency_transform.cc
# Opt level: O1

bool __thiscall
sptk::FrequencyTransform::Run
          (FrequencyTransform *this,vector<double,_std::allocator<double>_> *minimum_phase_sequence,
          vector<double,_std::allocator<double>_> *warped_sequence,Buffer *buffer)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  double *__s;
  double *pdVar7;
  bool bVar8;
  long lVar9;
  size_t __n;
  bool bVar10;
  ulong uVar11;
  size_type __new_size;
  
  if (this->is_valid_ == true) {
    bVar10 = false;
    if ((buffer != (Buffer *)0x0) &&
       (bVar10 = false, warped_sequence != (vector<double,_std::allocator<double>_> *)0x0)) {
      iVar3 = this->num_input_order_;
      lVar9 = (long)iVar3 + 1;
      if ((long)(minimum_phase_sequence->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(minimum_phase_sequence->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3 == lVar9) {
        __new_size = (long)this->num_output_order_ + 1;
        if ((long)(warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3 != __new_size) {
          std::vector<double,_std::allocator<double>_>::resize(warped_sequence,__new_size);
        }
        if ((long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 != __new_size) {
          std::vector<double,_std::allocator<double>_>::resize(&buffer->d_,__new_size);
        }
        if ((this->alpha_ != 0.0) || (NAN(this->alpha_))) {
          __s = (warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
          pdVar7 = (warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (__s != pdVar7) {
            memset(__s,0,((long)pdVar7 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
          }
          bVar10 = true;
          if (-1 < (long)this->num_input_order_) {
            dVar1 = this->alpha_;
            pdVar4 = (minimum_phase_sequence->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar7 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar3 = this->num_output_order_;
            lVar9 = (long)this->num_input_order_;
            do {
              dVar2 = *__s;
              *pdVar7 = dVar2;
              *__s = dVar2 * this->alpha_ + pdVar4[lVar9];
              if (0 < iVar3) {
                dVar2 = __s[1];
                pdVar7[1] = dVar2;
                __s[1] = *pdVar7 * (1.0 - dVar1 * dVar1) + dVar2 * this->alpha_;
              }
              if (1 < iVar3) {
                uVar11 = 2;
                do {
                  dVar2 = __s[uVar11];
                  pdVar7[uVar11] = dVar2;
                  __s[uVar11] = (dVar2 - __s[uVar11 - 1]) * this->alpha_ + pdVar7[uVar11 - 1];
                  uVar11 = uVar11 + 1;
                } while (iVar3 + 1 != uVar11);
              }
              bVar8 = 0 < lVar9;
              lVar9 = lVar9 + -1;
            } while (bVar8);
          }
        }
        else if (this->num_input_order_ < this->num_output_order_) {
          pdVar4 = (minimum_phase_sequence->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          __n = (long)(minimum_phase_sequence->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4;
          if (__n != 0) {
            memmove((warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start,pdVar4,__n);
          }
          pdVar5 = (warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          pdVar4 = pdVar5 + lVar9;
          bVar10 = true;
          if (pdVar4 != pdVar6) {
            memset(pdVar4,0,((long)pdVar6 + (-0x10 - (long)(pdVar5 + iVar3)) & 0xfffffffffffffff8U)
                            + 8);
          }
        }
        else {
          bVar10 = true;
          if ((int)__new_size != 0) {
            memmove((warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start,
                    (minimum_phase_sequence->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_start,__new_size * 8);
          }
        }
      }
    }
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool FrequencyTransform::Run(const std::vector<double>& minimum_phase_sequence,
                             std::vector<double>* warped_sequence,
                             FrequencyTransform::Buffer* buffer) const {
  // Check inputs.
  const int input_length(num_input_order_ + 1);
  if (!is_valid_ ||
      minimum_phase_sequence.size() != static_cast<std::size_t>(input_length) ||
      NULL == warped_sequence || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(num_output_order_ + 1);
  if (warped_sequence->size() != static_cast<std::size_t>(output_length)) {
    warped_sequence->resize(output_length);
  }
  if (buffer->d_.size() != static_cast<std::size_t>(output_length)) {
    buffer->d_.resize(output_length);
  }

  // There is no need to convert input when alpha is zero.
  if (0.0 == alpha_) {
    if (num_input_order_ < num_output_order_) {
      std::copy(minimum_phase_sequence.begin(), minimum_phase_sequence.end(),
                warped_sequence->begin());
      std::fill(warped_sequence->begin() + input_length, warped_sequence->end(),
                0.0);
    } else {
      std::copy(minimum_phase_sequence.begin(),
                minimum_phase_sequence.begin() + output_length,
                warped_sequence->begin());
    }
    return true;
  }

  std::fill(warped_sequence->begin(), warped_sequence->end(), 0.0);

  const double beta(1.0 - alpha_ * alpha_);
  const double* c(&(minimum_phase_sequence[0]));
  double* d(&buffer->d_[0]);
  double* g(&((*warped_sequence)[0]));

  // Apply recursive formula.
  for (int i(num_input_order_); 0 <= i; --i) {
    d[0] = g[0];
    g[0] = c[i] + alpha_ * d[0];
    if (1 <= num_output_order_) {
      d[1] = g[1];
      g[1] = beta * d[0] + alpha_ * d[1];
    }
    for (int m(2); m <= num_output_order_; ++m) {
      d[m] = g[m];
      g[m] = d[m - 1] + alpha_ * (d[m] - g[m - 1]);
    }
  }

  return true;
}